

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_scalar_split(secp256k1_scalar *full)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uchar zero [32];
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  uchar tmp [32];
  secp256k1_scalar s;
  
  zero[0x10] = '\0';
  zero[0x11] = '\0';
  zero[0x12] = '\0';
  zero[0x13] = '\0';
  zero[0x14] = '\0';
  zero[0x15] = '\0';
  zero[0x16] = '\0';
  zero[0x17] = '\0';
  zero[0x18] = '\0';
  zero[0x19] = '\0';
  zero[0x1a] = '\0';
  zero[0x1b] = '\0';
  zero[0x1c] = '\0';
  zero[0x1d] = '\0';
  zero[0x1e] = '\0';
  zero[0x1f] = '\0';
  zero[0] = '\0';
  zero[1] = '\0';
  zero[2] = '\0';
  zero[3] = '\0';
  zero[4] = '\0';
  zero[5] = '\0';
  zero[6] = '\0';
  zero[7] = '\0';
  zero[8] = '\0';
  zero[9] = '\0';
  zero[10] = '\0';
  zero[0xb] = '\0';
  zero[0xc] = '\0';
  zero[0xd] = '\0';
  zero[0xe] = '\0';
  zero[0xf] = '\0';
  secp256k1_scalar_split_lambda(&s1,&slam,full);
  secp256k1_scalar_mul(&s,&secp256k1_const_lambda,&slam);
  secp256k1_scalar_add(&s,&s,&s1);
  iVar1 = secp256k1_scalar_eq(&s,full);
  if (iVar1 == 0) {
    pcVar3 = "test condition failed: secp256k1_scalar_eq(&s, full)";
    uVar2 = 0x15de;
  }
  else {
    iVar1 = secp256k1_scalar_is_high(&s1);
    if (iVar1 != 0) {
      secp256k1_scalar_negate(&s1,&s1);
    }
    iVar1 = secp256k1_scalar_is_high(&slam);
    if (iVar1 != 0) {
      secp256k1_scalar_negate(&slam,&slam);
    }
    secp256k1_scalar_get_b32(tmp,&s1);
    iVar1 = secp256k1_memcmp_var(zero,tmp,0x10);
    if (iVar1 == 0) {
      secp256k1_scalar_get_b32(tmp,&slam);
      iVar1 = secp256k1_memcmp_var(zero,tmp,0x10);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = "test condition failed: secp256k1_memcmp_var(zero, tmp, 16) == 0";
      uVar2 = 0x15eb;
    }
    else {
      pcVar3 = "test condition failed: secp256k1_memcmp_var(zero, tmp, 16) == 0";
      uVar2 = 0x15e9;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}